

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int decode_one_ech_config
              (ptls_hpke_kem_t **kems,ptls_hpke_cipher_suite_t **ciphers,
              st_decoded_ech_config_t *decoded,uint8_t **src,uint8_t *end)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  uint8_t *puVar6;
  int iVar7;
  ushort *puVar8;
  char *name;
  byte *pbVar9;
  ushort *puVar10;
  ptls_hpke_kem_t *ppVar11;
  ulong uVar12;
  int iVar13;
  ptls_hpke_kem_t **pppVar14;
  byte *pbVar15;
  ptls_hpke_cipher_suite_t *ppVar16;
  ptls_hpke_cipher_suite_t **pppVar17;
  
  (decoded->bytes).base = (uint8_t *)0x0;
  (decoded->bytes).len = 0;
  (decoded->public_name).base = (uint8_t *)0x0;
  (decoded->public_name).len = 0;
  decoded->cipher = (ptls_hpke_cipher_suite_t *)0x0;
  *(undefined8 *)&decoded->max_name_length = 0;
  (decoded->public_key).base = (uint8_t *)0x0;
  (decoded->public_key).len = 0;
  *(undefined8 *)decoded = 0;
  decoded->kem = (ptls_hpke_kem_t *)0x0;
  puVar6 = *src;
  iVar13 = 0x32;
  if (puVar6 != end) {
    *src = puVar6 + 1;
    decoded->id = *puVar6;
    puVar8 = (ushort *)*src;
    if (1 < (long)end - (long)puVar8) {
      uVar4 = *puVar8;
      puVar8 = puVar8 + 1;
      *src = (uint8_t *)puVar8;
      ppVar11 = *kems;
      if (ppVar11 != (ptls_hpke_kem_t *)0x0) {
        pppVar14 = kems + 1;
        do {
          if (ppVar11->id == (uint16_t)(uVar4 << 8 | uVar4 >> 8)) {
            decoded->kem = ppVar11;
            puVar8 = (ushort *)*src;
            break;
          }
          ppVar11 = *pppVar14;
          pppVar14 = pppVar14 + 1;
        } while (ppVar11 != (ptls_hpke_kem_t *)0x0);
      }
      if (1 < (ulong)((long)end - (long)puVar8)) {
        *src = (byte *)((long)puVar8 + 1);
        uVar12 = (ulong)(byte)*puVar8 * 0x100;
        puVar10 = puVar8 + 1;
        *src = (uint8_t *)puVar10;
        if ((uVar12 + *(byte *)((long)puVar8 + 1)) - 1 < (ulong)((long)end - (long)puVar10)) {
          uVar12 = uVar12 | *(byte *)((long)puVar8 + 1);
          (decoded->public_key).base = (uint8_t *)puVar10;
          pbVar9 = (byte *)((long)puVar10 + uVar12);
          (decoded->public_key).len = uVar12;
          *src = pbVar9;
          if (1 < (ulong)((long)end - (long)pbVar9)) {
            *src = pbVar9 + 1;
            bVar2 = *pbVar9;
            puVar8 = (ushort *)(pbVar9 + 2);
            *src = (uint8_t *)puVar8;
            if ((ulong)CONCAT11(bVar2,pbVar9[1]) <= (ulong)((long)end - (long)puVar8)) {
              puVar10 = (ushort *)((ulong)CONCAT11(bVar2,pbVar9[1]) + (long)puVar8);
              name = (char *)0x0;
              do {
                if ((long)puVar10 - (long)puVar8 < 2) goto LAB_0011dc3f;
                uVar4 = *puVar8;
                *src = (uint8_t *)(puVar8 + 1);
                if ((long)puVar10 - (long)(puVar8 + 1) < 2) goto LAB_0011dc3f;
                uVar5 = puVar8[1];
                puVar8 = puVar8 + 2;
                *src = (uint8_t *)puVar8;
                if ((decoded->cipher == (ptls_hpke_cipher_suite_t *)0x0) &&
                   (ppVar16 = *ciphers, ppVar16 != (ptls_hpke_cipher_suite_t *)0x0)) {
                  pppVar17 = ciphers + 1;
                  do {
                    if (((ppVar16->id).kdf == (uint16_t)(uVar4 << 8 | uVar4 >> 8)) &&
                       ((ppVar16->id).aead == (uint16_t)(uVar5 << 8 | uVar5 >> 8))) {
                      decoded->cipher = ppVar16;
                      puVar8 = (ushort *)*src;
                      break;
                    }
                    ppVar16 = *pppVar17;
                    pppVar17 = pppVar17 + 1;
                  } while (ppVar16 != (ptls_hpke_cipher_suite_t *)0x0);
                }
              } while (puVar8 != puVar10);
              if (puVar10 != (ushort *)end) {
                *src = (byte *)((long)puVar8 + 1);
                decoded->max_name_length = (byte)*puVar8;
                pbVar9 = *src;
                if (pbVar9 != end) {
                  pbVar15 = pbVar9 + 1;
                  *src = pbVar15;
                  uVar12 = (ulong)*pbVar9;
                  if ((uVar12 <= (ulong)((long)end - (long)pbVar15)) && (uVar12 != 0)) {
                    name = (char *)malloc(uVar12 + 1);
                    if (name != (char *)0x0) {
                      pbVar9 = pbVar15 + uVar12;
                      memcpy(name,pbVar15,uVar12);
                      name[uVar12] = '\0';
                      iVar7 = ptls_server_name_is_ipaddr(name);
                      if (iVar7 == 0) {
                        puVar6 = *src;
                        (decoded->public_name).base = puVar6;
                        (decoded->public_name).len = (long)pbVar9 - (long)puVar6;
                      }
                      else {
                        decoded->kem = (ptls_hpke_kem_t *)0x0;
                        decoded->cipher = (ptls_hpke_cipher_suite_t *)0x0;
                      }
                      *src = pbVar9;
                      if (1 < (ulong)((long)end - (long)pbVar9)) {
                        *src = pbVar9 + 1;
                        bVar2 = *pbVar9;
                        pbVar15 = pbVar9 + 2;
                        *src = pbVar15;
                        uVar12 = (ulong)CONCAT11(bVar2,pbVar9[1]);
                        if (uVar12 <= (ulong)((long)end - (long)pbVar15)) {
                          pbVar9 = pbVar9 + uVar12 + 2;
                          if (uVar12 != 0) {
                            do {
                              if ((long)pbVar9 - (long)pbVar15 < 2) goto LAB_0011dc3f;
                              bVar2 = *pbVar15;
                              *src = pbVar15 + 2;
                              if ((ulong)((long)pbVar9 - (long)(pbVar15 + 2)) < 2)
                              goto LAB_0011dc3f;
                              *src = pbVar15 + 3;
                              bVar3 = pbVar15[2];
                              pbVar1 = pbVar15 + 4;
                              *src = pbVar1;
                              if ((ulong)((long)pbVar9 - (long)pbVar1) <
                                  (ulong)CONCAT11(bVar3,pbVar15[3])) goto LAB_0011dc3f;
                              pbVar15 = pbVar1 + CONCAT11(bVar3,pbVar15[3]);
                              *src = pbVar15;
                              if ((char)bVar2 < '\0') {
                                decoded->kem = (ptls_hpke_kem_t *)0x0;
                                decoded->cipher = (ptls_hpke_cipher_suite_t *)0x0;
                                pbVar15 = *src;
                              }
                            } while (pbVar15 < pbVar9);
                          }
                          if ((pbVar15 == pbVar9) && (iVar13 = 0x32, pbVar9 == end)) {
                            iVar13 = 0;
                          }
                        }
                      }
                      goto LAB_0011dc3f;
                    }
                    iVar13 = 0x201;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  name = (char *)0x0;
LAB_0011dc3f:
  free(name);
  return iVar13;
}

Assistant:

static int decode_one_ech_config(ptls_hpke_kem_t **kems, ptls_hpke_cipher_suite_t **ciphers,
                                 struct st_decoded_ech_config_t *decoded, const uint8_t **src, const uint8_t *const end)
{
    char *public_name_buf = NULL;
    int ret;

    *decoded = (struct st_decoded_ech_config_t){0};

    if ((ret = ptls_decode8(&decoded->id, src, end)) != 0)
        goto Exit;
    uint16_t kem_id;
    if ((ret = ptls_decode16(&kem_id, src, end)) != 0)
        goto Exit;
    for (size_t i = 0; kems[i] != NULL; ++i) {
        if (kems[i]->id == kem_id) {
            decoded->kem = kems[i];
            break;
        }
    }
    ptls_decode_open_block(*src, end, 2, {
        if (*src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        decoded->public_key = ptls_iovec_init(*src, end - *src);
        *src = end;
    });
    ptls_decode_open_block(*src, end, 2, {
        do {
            uint16_t kdf_id;
            uint16_t aead_id;
            if ((ret = ptls_decode16(&kdf_id, src, end)) != 0)
                goto Exit;
            if ((ret = ptls_decode16(&aead_id, src, end)) != 0)
                goto Exit;
            if (decoded->cipher == NULL) {
                for (size_t i = 0; ciphers[i] != NULL; ++i) {
                    if (ciphers[i]->id.kdf == kdf_id && ciphers[i]->id.aead == aead_id) {
                        decoded->cipher = ciphers[i];
                        break;
                    }
                }
            }
        } while (*src != end);
    });
    if ((ret = ptls_decode8(&decoded->max_name_length, src, end)) != 0)
        goto Exit;

#define SKIP_DECODED()                                                                                                             \
    do {                                                                                                                           \
        decoded->kem = NULL;                                                                                                       \
        decoded->cipher = NULL;                                                                                                    \
    } while (0)

    /* Decode public_name. The specification requires clients to ignore (upon parsing ESNIConfigList) or reject (upon handshake)
     * public names that are not DNS names or IPv4 addresses. We ignore IPv4 and v6 addresses during parsing (IPv6 addresses never
     * looks like DNS names), and delegate the responsibility of rejecting non-DNS names to the certificate verify callback. */
    ptls_decode_open_block(*src, end, 1, {
        if (*src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        if ((public_name_buf = duplicate_as_str(*src, end - *src)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        if (ptls_server_name_is_ipaddr(public_name_buf)) {
            SKIP_DECODED();
        } else {
            decoded->public_name = ptls_iovec_init(*src, end - *src);
        }
        *src = end;
    });

    ptls_decode_block(*src, end, 2, {
        while (*src < end) {
            uint16_t type;
            if ((ret = ptls_decode16(&type, src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(*src, end, 2, { *src = end; });
            /* if a critital extension is found, indicate that the config cannot be used */
            if ((type & 0x8000) != 0)
                SKIP_DECODED();
        }
    });

#undef SKIP_DECODED

Exit:
    free(public_name_buf);
    return ret;
}